

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t gnu_add_sparse_entry(archive_read *a,tar *tar,int64_t offset,int64_t remaining)

{
  sparse_block *psVar1;
  sparse_block *psVar2;
  char *fmt;
  int error_number;
  
  psVar1 = (sparse_block *)malloc(0x20);
  if (psVar1 == (sparse_block *)0x0) {
    fmt = "Out of memory";
    error_number = 0xc;
  }
  else {
    psVar1->remaining = 0;
    *(undefined8 *)&psVar1->hole = 0;
    psVar1->next = (sparse_block *)0x0;
    psVar1->offset = 0;
    psVar2 = (sparse_block *)&tar->sparse_list;
    if (tar->sparse_last != (sparse_block *)0x0) {
      psVar2 = tar->sparse_last;
    }
    psVar2->next = psVar1;
    tar->sparse_last = psVar1;
    if (-1 < (remaining | offset)) {
      psVar1->offset = offset;
      psVar1->remaining = remaining;
      return L'\0';
    }
    fmt = "Malformed sparse map data";
    error_number = -1;
  }
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
gnu_add_sparse_entry(struct archive_read *a, struct tar *tar,
    int64_t offset, int64_t remaining)
{
	struct sparse_block *p;

	p = (struct sparse_block *)malloc(sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	memset(p, 0, sizeof(*p));
	if (tar->sparse_last != NULL)
		tar->sparse_last->next = p;
	else
		tar->sparse_list = p;
	tar->sparse_last = p;
	if (remaining < 0 || offset < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC, "Malformed sparse map data");
		return (ARCHIVE_FATAL);
	}
	p->offset = offset;
	p->remaining = remaining;
	return (ARCHIVE_OK);
}